

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O0

Node<MeshLib::Edge> * __thiscall
AVL::Node<MeshLib::Edge>::find_node(Node<MeshLib::Edge> *this,Edge *inData)

{
  bool bVar1;
  Edge *inData_local;
  Node<MeshLib::Edge> *this_local;
  
  if (this == (Node<MeshLib::Edge> *)0x0) {
    this_local = (Node<MeshLib::Edge> *)0x0;
  }
  else {
    bVar1 = MeshLib::Edge::operator==(inData,this->data);
    this_local = this;
    if (!bVar1) {
      bVar1 = MeshLib::Edge::operator<(inData,this->data);
      if (bVar1) {
        this_local = find_node(this->left,inData);
      }
      else {
        this_local = find_node(this->right,inData);
      }
    }
  }
  return this_local;
}

Assistant:

Node<T> * find_node (T * inData) 
    {
        if (this == NULL)
            return NULL;

        if ( *inData == *data)
            return this;

        if (*inData < *data)
            return left -> find_node (inData);
        else
            return right -> find_node (inData);
    }